

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioVoice_SetEffectParameters
                   (FAudioVoice *voice,uint32_t EffectIndex,void *pParameters,
                   uint32_t ParametersByteSize,uint32_t OperationSet)

{
  void *pvVar1;
  
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    if ((voice->effects).parameters[EffectIndex] == (void *)0x0) {
      pvVar1 = (*voice->audio->pMalloc)((size_t)ParametersByteSize);
      (voice->effects).parameters[EffectIndex] = pvVar1;
      (voice->effects).parameterSizes[EffectIndex] = ParametersByteSize;
    }
    FAudio_PlatformLockMutex(voice->effectLock);
    if ((voice->effects).parameterSizes[EffectIndex] < ParametersByteSize) {
      pvVar1 = (*voice->audio->pRealloc)
                         ((voice->effects).parameters[EffectIndex],(size_t)ParametersByteSize);
      (voice->effects).parameters[EffectIndex] = pvVar1;
      (voice->effects).parameterSizes[EffectIndex] = ParametersByteSize;
    }
    SDL_memcpy((voice->effects).parameters[EffectIndex],pParameters,ParametersByteSize);
    (voice->effects).parameterUpdates[EffectIndex] = '\x01';
    FAudio_PlatformUnlockMutex(voice->effectLock);
  }
  else {
    FAudio_OPERATIONSET_QueueSetEffectParameters
              (voice,EffectIndex,pParameters,ParametersByteSize,OperationSet);
  }
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetEffectParameters(
	FAudioVoice *voice,
	uint32_t EffectIndex,
	const void *pParameters,
	uint32_t ParametersByteSize,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetEffectParameters(
			voice,
			EffectIndex,
			pParameters,
			ParametersByteSize,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	if (voice->effects.parameters[EffectIndex] == NULL)
	{
		voice->effects.parameters[EffectIndex] = voice->audio->pMalloc(
			ParametersByteSize
		);
		voice->effects.parameterSizes[EffectIndex] = ParametersByteSize;
	}
	FAudio_PlatformLockMutex(voice->effectLock);
	LOG_MUTEX_LOCK(voice->audio, voice->effectLock)
	if (voice->effects.parameterSizes[EffectIndex] < ParametersByteSize)
	{
		voice->effects.parameters[EffectIndex] = voice->audio->pRealloc(
			voice->effects.parameters[EffectIndex],
			ParametersByteSize
		);
		voice->effects.parameterSizes[EffectIndex] = ParametersByteSize;
	}
	FAudio_memcpy(
		voice->effects.parameters[EffectIndex],
		pParameters,
		ParametersByteSize
	);
	voice->effects.parameterUpdates[EffectIndex] = 1;
	FAudio_PlatformUnlockMutex(voice->effectLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->effectLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}